

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistoryTree.cpp
# Opt level: O1

void __thiscall
JointActionObservationHistoryTree::SetSuccessor
          (JointActionObservationHistoryTree *this,Index aI,Index oI,
          JointActionObservationHistoryTree *suc)

{
  TreeNode<JointActionObservationHistory> *suc_00;
  _Rb_tree_header *p_Var1;
  E *this_00;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  ulong sucI;
  
  if (this->_m_nodeType != O_SUC) {
    sucI = (ulong)aI;
    p_Var1 = &(this->super_TreeNode<JointActionObservationHistory>)._m_successor._M_t._M_impl.
              super__Rb_tree_header;
    p_Var3 = (this->super_TreeNode<JointActionObservationHistory>)._m_successor._M_t._M_impl.
             super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var1->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < sucI]) {
      if (*(ulong *)(p_Var3 + 1) >= sucI) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var1) && (p_Var3 = p_Var2, sucI < *(ulong *)(p_Var2 + 1))) {
      p_Var3 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 == p_Var1) {
      suc_00 = (TreeNode<JointActionObservationHistory> *)operator_new(0x60);
      p_Var1 = &(suc_00->_m_successor)._M_t._M_impl.super__Rb_tree_header;
      (suc_00->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (suc_00->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      (suc_00->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (suc_00->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (suc_00->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      suc_00->_m_pred = (TreeNode<JointActionObservationHistory> *)0x0;
      suc_00->_m_index = 0x2a;
      suc_00->_m_indexValid = false;
      suc_00->_m_containedElem = (JointActionObservationHistory *)0x0;
      suc_00->_vptr_TreeNode = (_func_int **)&PTR__TreeNode_005cb3c8;
      *(undefined4 *)&suc_00[1]._vptr_TreeNode = 1;
      TreeNode<JointActionObservationHistory>::SetSuccessor
                (&this->super_TreeNode<JointActionObservationHistory>,sucI,suc_00);
    }
    else {
      suc_00 = TreeNode<JointActionObservationHistory>::GetSuccessor
                         (&this->super_TreeNode<JointActionObservationHistory>,sucI);
    }
    TreeNode<JointActionObservationHistory>::SetSuccessor
              (suc_00,(ulong)oI,&suc->super_TreeNode<JointActionObservationHistory>);
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,
       "Trying JointActionObservationHistoryTree::SetSuccessor(Index aI, Index oI, JointActionObservationHistoryTree* suc)  on O_SUC node"
      );
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void JointActionObservationHistoryTree::SetSuccessor(Index aI, Index oI,
        JointActionObservationHistoryTree* suc)
{
    if (_m_nodeType == O_SUC)
        throw E("Trying JointActionObservationHistoryTree::SetSuccessor(Index aI, Index oI, JointActionObservationHistoryTree* suc)  on O_SUC node");

    //first see if necessary to create a new  intermediate node
    JointActionObservationHistoryTree* oNode; 
    if (this->TreeNode<JointActionObservationHistory>::ExistsSuccessor(aI))
        oNode = (JointActionObservationHistoryTree*)
            this->TreeNode<JointActionObservationHistory>::GetSuccessor(aI);
    else //we need to create an intermediate node
    {
        oNode = new JointActionObservationHistoryTree(O_SUC);
        //which is the aI'th successor of this node
        this->TreeNode<JointActionObservationHistory>::SetSuccessor(aI, oNode);
    }

    //let oNode point to the actual successor.
    //Note: SetSuccessor with 1 index should give no problem for O_SUC nodes
    oNode->TreeNode<JointActionObservationHistory>::SetSuccessor(oI, suc);
}